

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbo.cpp
# Opt level: O1

int __thiscall vera::Fbo::bind(Fbo *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int in_EAX;
  undefined4 in_register_0000000c;
  
  if (this->m_binded == false) {
    glGetIntegerv(0x8ca6,&this->m_old_fbo_id,__addr,CONCAT44(in_register_0000000c,__len));
    glBindTexture(0xde1,0);
    glBindFramebuffer(0x8d40,this->m_fbo_id);
    glViewport(0,0,this->m_width,this->m_height);
    in_EAX = glClearColor(0,0,0,0);
    if (this->m_id != 0) {
      in_EAX = glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,this->m_id,0);
    }
    if (this->m_depth_id != 0) {
      in_EAX = glFramebufferTexture2D(0x8d40,0x8d00,0xde1,this->m_depth_id,0);
    }
    if (this->m_autoclear == true) {
      in_EAX = glClear((this->m_depth | 0x40) << 8);
    }
    this->m_binded = true;
  }
  return in_EAX;
}

Assistant:

void Fbo::bind() {
    if (!m_binded) {
        glGetIntegerv(GL_FRAMEBUFFER_BINDING, (GLint *)&m_old_fbo_id);
        glBindTexture(GL_TEXTURE_2D, 0);

        glBindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
        glViewport(0.0f, 0.0f, m_width, m_height);
        glClearColor(0.0f, 0.0f, 0.0f, 0.0f);

        if (m_id != 0)
            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_id, 0);

        if (m_depth_id != 0) 
            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, m_depth_id, 0);

        #if !defined(__EMSCRIPTEN__)
        if (m_autoclear) {
            if (m_depth)
                glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            else
                glClear(GL_COLOR_BUFFER_BIT);
        }
        #endif

        m_binded = true;
    }
}